

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O1

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
          (StateQueryMemoryWriteGuard<float[16]> *this,TestContext *testCtx)

{
  ostringstream *this_00;
  ulong uVar1;
  qpTestResult qVar2;
  ulong uVar3;
  char *description;
  undefined1 local_190 [384];
  
  if (*(char *)this->m_preguard == -0x22) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 0x3f) break;
      uVar1 = uVar3 + 1;
    } while (*(char *)((long)this->m_preguard + uVar3 + 1) == -0x22);
    if (uVar3 < 0x3f) goto LAB_003b991e;
    if (*(char *)this->m_postguard == -0x22) {
      uVar1 = 0;
      do {
        uVar3 = uVar1;
        if (uVar3 == 0x3f) break;
        uVar1 = uVar3 + 1;
      } while (*(char *)((long)this->m_postguard + uVar3 + 1) == -0x22);
      if (0x3e < uVar3) {
        if (*(char *)this->m_value != -0x22) {
          return true;
        }
        uVar1 = 0;
        do {
          uVar3 = uVar1;
          if (uVar3 == 0x3f) break;
          uVar1 = uVar3 + 1;
        } while (*(char *)((long)this->m_value + uVar3 + 1) == -0x22);
        if (uVar3 < 0x3f) {
          return true;
        }
        local_190._0_8_ = testCtx->m_log;
        this_00 = (ostringstream *)(local_190 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"// ERROR: Get* did not return a value",0x25);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
        qVar2 = testCtx->m_testResult;
        description = "Get* did not return a value";
        goto LAB_003b997e;
      }
    }
    local_190._0_8_ = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"// ERROR: Post-guard value was modified ",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
LAB_003b991e:
    local_190._0_8_ = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"// ERROR: Pre-guard value was modified ",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  qVar2 = testCtx->m_testResult;
  description = "Get* did an illegal memory write";
LAB_003b997e:
  if ((qVar2 == QP_TEST_RESULT_PASS) || (qVar2 == QP_TEST_RESULT_LAST)) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,description);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::TestContext& testCtx) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Pre-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isPostguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Post-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isUndefined())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Get* did not return a value" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did not return a value");

		return false;
	}

	return true;
}